

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void getPeerArrays(int MySize,int MyRank,int PeerSize,int **forwardArray,int **reverseArray)

{
  int *piVar1;
  void *pvVar2;
  long *in_RCX;
  int in_EDX;
  int in_EDI;
  long *in_R8;
  int *reverse;
  
  if (in_EDI < in_EDX) {
    piVar1 = PeerArray(reverse._4_4_,(int)reverse,in_EDI);
    *in_RCX = (long)piVar1;
    if (in_R8 != (long *)0x0) {
      pvVar2 = malloc(8);
      *in_R8 = (long)pvVar2;
      *(undefined4 *)*in_R8 = *(undefined4 *)*in_RCX;
      *(undefined4 *)(*in_R8 + 4) = 0xffffffff;
    }
  }
  else {
    pvVar2 = malloc(8);
    *in_RCX = (long)pvVar2;
    *(undefined4 *)(*in_RCX + 4) = 0xffffffff;
    piVar1 = reversePeerArray(forwardArray._4_4_,(int)forwardArray,reverseArray._4_4_,
                              (int *)CONCAT44(reverse._4_4_,(int)reverse));
    if (in_R8 == (long *)0x0) {
      free(piVar1);
    }
    else {
      *in_R8 = (long)piVar1;
    }
  }
  return;
}

Assistant:

extern void getPeerArrays(int MySize, int MyRank, int PeerSize, int **forwardArray,
                          int **reverseArray)
{
    if (MySize < PeerSize)
    {
        /* more of them than me.  I will have at least one entry in my forward
         * array. */
        *forwardArray = PeerArray(MySize, MyRank, PeerSize);
        /* all need to be notified, but I'm only the forward peer to one of them
         * (the first), so send reverse peer entry only to zeroth entry */
        if (reverseArray)
        {
            *reverseArray = malloc(sizeof(int) * 2);
            (*reverseArray)[0] = (*forwardArray)[0];
            (*reverseArray)[1] = -1;
        }
    }
    else
    {
        /* More of me than of them, there may be 0 or 1 entries in my forward
         * array, but there must be one opposing peer that I should notify so
         * that I am in his forward array */
        int *reverse;
        *forwardArray = malloc(sizeof(int) * 2);
        (*forwardArray)[1] = -1;
        reverse = reversePeerArray(MySize, MyRank, PeerSize, &((*forwardArray)[0]));
        if (reverseArray)
        {
            *reverseArray = reverse;
        }
        else
        {
            free(reverse);
        }
    }
}